

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-parse-content.cc
# Opt level: O3

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," filename page-number");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "Prints a dump of the objects in the content streams of the given page.")
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Pages are numbered from 1.");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(2);
}

Assistant:

void
usage()
{
    std::cerr << "Usage: " << whoami << " filename page-number" << std::endl
              << "Prints a dump of the objects in the content streams of the given page."
              << std::endl
              << "Pages are numbered from 1." << std::endl;
    exit(2);
}